

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  Slice b;
  Slice a;
  Slice local_40;
  Slice local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*aptr < '\0') {
    pcVar2 = GetVarint32PtrFallback(aptr,aptr + 5,(uint32_t *)&local_30);
  }
  else {
    pcVar2 = aptr + 1;
    local_30.data_._0_4_ = (int)*aptr;
  }
  local_30.size_ = (size_t)(uint)local_30.data_;
  local_30.data_ = pcVar2;
  if (*bptr < '\0') {
    pcVar2 = GetVarint32PtrFallback(bptr,bptr + 5,(uint32_t *)&local_40);
  }
  else {
    pcVar2 = bptr + 1;
    local_40.data_._0_4_ = (int)*bptr;
  }
  local_40.size_ = (size_t)(uint)local_40.data_;
  local_40.data_ = pcVar2;
  iVar1 = InternalKeyComparator::Compare(&this->comparator,&local_30,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int MemTable::KeyComparator::operator()(const char* aptr,
                                        const char* bptr) const {
  // Internal keys are encoded as length-prefixed strings.
  Slice a = GetLengthPrefixedSlice(aptr);
  Slice b = GetLengthPrefixedSlice(bptr);
  return comparator.Compare(a, b);
}